

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkproxy.cpp
# Opt level: O3

void __thiscall QNetworkProxy::setType(QNetworkProxy *this,ProxyType type)

{
  Int IVar1;
  ulong uVar2;
  
  QSharedDataPointer<QNetworkProxyPrivate>::detach(&this->d);
  ((this->d).d.ptr)->type = type;
  QSharedDataPointer<QNetworkProxyPrivate>::detach(&this->d);
  if (((this->d).d.ptr)->capabilitiesSet == false) {
    uVar2 = 0;
    if (type < (HttpCachingProxy|NoProxy)) {
      uVar2 = (ulong)type;
    }
    IVar1 = (&defaultCapabilitiesForType(QNetworkProxy::ProxyType)::defaults)[uVar2];
    QSharedDataPointer<QNetworkProxyPrivate>::detach(&this->d);
    (((this->d).d.ptr)->capabilities).super_QFlagsStorageHelper<QNetworkProxy::Capability,_4>.
    super_QFlagsStorage<QNetworkProxy::Capability>.i = IVar1;
  }
  return;
}

Assistant:

void QNetworkProxy::setType(QNetworkProxy::ProxyType type)
{
    d->type = type;
    if (!d->capabilitiesSet)
        d->capabilities = defaultCapabilitiesForType(type);
}